

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

void __thiscall Vector<Fad<double>_>::reserve(Vector<Fad<double>_> *this,int ssize)

{
  undefined1 auVar1 [16];
  long lVar2;
  char *__s;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type *psVar4;
  int in_ESI;
  int *in_RDI;
  allocator<char> *__a;
  Fad<double> *in_stack_ffffffffffffff70;
  size_type *local_78;
  allocator<char> local_41;
  string local_40 [64];
  
  if (in_ESI != 0) {
    *in_RDI = in_ESI;
    __s = (char *)(long)*in_RDI;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = __s;
    uVar3 = SUB168(auVar1 * ZEXT816(0x20),0);
    __a = (allocator<char> *)(uVar3 + 8);
    if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar3) {
      __a = (allocator<char> *)0xffffffffffffffff;
    }
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              operator_new__((ulong)__a);
    *(char **)this_00 = __s;
    psVar4 = &this_00->_M_string_length;
    if (__s != (char *)0x0) {
      lVar2 = (long)__s * 4;
      local_78 = psVar4;
      do {
        Fad<double>::Fad(in_stack_ffffffffffffff70);
        local_78 = local_78 + 4;
      } while (local_78 != psVar4 + lVar2);
    }
    *(size_type **)(in_RDI + 2) = psVar4;
    if (*(long *)(in_RDI + 2) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
      ::error((string *)0x1eaa296);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator(&local_41);
    }
  }
  return;
}

Assistant:

inline void Vector< T >::reserve(int ssize)
{
#ifdef CHECK_SIZE
    if ( ptr_to_data != 0 ) error("Vector<>::reserve(), array already allocted");

    if ( ssize <0 ) error("Vector<>::reserve(), negative size");
#endif

    if (ssize != 0){
	num_elts = ssize;
	ptr_to_data = new T[num_elts];              
	
	if ( ptr_to_data == 0 ) error("Vector<>::reserve(), not enough memory");
    }
#ifdef DEBUG
    fprintf(stderr,"Vector<>::reserve()         |                   | adr =  %x \n", ptr_to_data);
#endif
}